

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  ImGuiKeyModFlags IVar1;
  ImGuiContextHook *pIVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow **ppIVar5;
  float *pfVar6;
  float x2;
  float fVar7;
  ImVec4 IVar8;
  int i_2;
  ImGuiWindow *window;
  int i_1;
  float memory_compact_start_time;
  int i;
  ImGuiViewportP *viewport;
  int n_2;
  int n_1;
  ImRect virtual_space;
  int n;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000384;
  bool *in_stack_00000388;
  char *in_stack_00000390;
  float fVar9;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ImGuiContextHook *in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  ImGuiContextHookType in_stack_ffffffffffffff8c;
  ImGuiContextHookType hook_type;
  ImGuiContext *in_stack_ffffffffffffff90;
  int local_64;
  ImVec2 local_5c;
  int local_54;
  ImGuiViewportP *local_50;
  int local_44;
  ImVec4 local_40;
  ImRect local_30;
  int local_20;
  ImRect local_1c;
  int local_c;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_c = (GImGui->Hooks).Size;
  while (local_c = local_c + -1, -1 < local_c) {
    pIVar2 = ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
    if (*(int *)(pIVar2 + 4) == 7) {
      in_stack_ffffffffffffff78 = (ImGuiContextHook *)&local_8->Hooks;
      ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
      ImVector<ImGuiContextHook>::erase
                ((ImVector<ImGuiContextHook> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  CallContextHooks(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  ErrorCheckNewFrameSanityChecks();
  UpdateSettings();
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(int)in_stack_ffffffffffffff6c);
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x78;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    x2 = 3.4028235e+38;
  }
  else {
    x2 = 1.0 / (local_8->FramerateSecPerFrameAccum / 120.0);
  }
  (local_8->IO).Framerate = x2;
  UpdateViewportsNewFrame();
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)in_stack_ffffffffffffff80);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff80,
                 (float)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 SUB84(in_stack_ffffffffffffff78,0),x2,in_stack_ffffffffffffff70);
  for (local_20 = 0; fVar7 = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20),
      local_20 < (local_8->Viewports).Size; local_20 = local_20 + 1) {
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_20);
    local_30 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x12c1d5);
    ImRect::Add(&local_1c,&local_30);
  }
  IVar8 = ImRect::ToVec4((ImRect *)0x12c207);
  local_40._0_8_ = IVar8._0_8_;
  (local_8->DrawListSharedData).ClipRectFullscreen.x = local_40.x;
  (local_8->DrawListSharedData).ClipRectFullscreen.y = local_40.y;
  local_40._8_8_ = IVar8._8_8_;
  (local_8->DrawListSharedData).ClipRectFullscreen.z = local_40.z;
  (local_8->DrawListSharedData).ClipRectFullscreen.w = local_40.w;
  (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
  local_40 = IVar8;
  ImDrawListSharedData::SetCircleSegmentMaxError
            ((ImDrawListSharedData *)in_stack_ffffffffffffff80,fVar7);
  (local_8->DrawListSharedData).InitialFlags = 0;
  if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
  }
  if ((((local_8->Style).AntiAliasedLinesUseTex & 1U) != 0) &&
     ((local_8->Font->ContainerAtlas->Flags & 4U) == 0)) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
  }
  if (((local_8->IO).BackendFlags & 8U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 8;
  }
  for (local_44 = 0; local_44 < (local_8->Viewports).Size; local_44 = local_44 + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_44);
    local_50 = *ppIVar3;
    ImDrawData::Clear((ImDrawData *)0x12c393);
  }
  if (((local_8->DragDropActive & 1U) != 0) &&
     ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
    KeepAliveID((local_8->DragDropPayload).SourceId);
  }
  if (local_8->HoveredIdPreviousFrame == 0) {
    local_8->HoveredIdTimer = 0.0;
  }
  if ((local_8->HoveredIdPreviousFrame == 0) ||
     ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
    local_8->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_8->HoveredId != 0) {
    local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
  }
  if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
    local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
  }
  local_8->HoveredIdPreviousFrame = local_8->HoveredId;
  local_8->HoveredIdPreviousFrameUsingMouseWheel = (bool)(local_8->HoveredIdUsingMouseWheel & 1);
  local_8->HoveredId = 0;
  local_8->HoveredIdAllowOverlap = false;
  local_8->HoveredIdUsingMouseWheel = false;
  local_8->HoveredIdDisabled = false;
  if (((local_8->ActiveIdIsAlive != local_8->ActiveId) &&
      (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) && (local_8->ActiveId != 0)) {
    ClearActiveID();
  }
  if (local_8->ActiveId != 0) {
    local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
  }
  local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
  local_8->ActiveIdPreviousFrame = local_8->ActiveId;
  local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
  local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
  local_8->ActiveIdIsAlive = 0;
  local_8->ActiveIdHasBeenEditedThisFrame = false;
  local_8->ActiveIdPreviousFrameIsAlive = false;
  local_8->ActiveIdIsJustActivated = false;
  if ((local_8->TempInputId != 0) && (local_8->ActiveId != local_8->TempInputId)) {
    local_8->TempInputId = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavDirMask = 0;
    local_8->ActiveIdUsingNavInputMask = 0;
    local_8->ActiveIdUsingKeyInputMask = 0;
  }
  local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
  local_8->DragDropAcceptIdCurr = 0;
  local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_8->DragDropWithinSource = false;
  local_8->DragDropWithinTarget = false;
  local_8->DragDropHoldJustPressedId = 0;
  IVar1 = GetMergedKeyModFlags();
  (local_8->IO).KeyMods = IVar1;
  memcpy((local_8->IO).KeysDownDurationPrev,(local_8->IO).KeysDownDuration,0x800);
  for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
    if (((local_8->IO).KeysDown[local_54] & 1U) == 0) {
      in_stack_ffffffffffffff6c = -1.0;
    }
    else {
      pfVar6 = (local_8->IO).KeysDownDuration + local_54;
      if (0.0 < *pfVar6 || *pfVar6 == 0.0) {
        in_stack_ffffffffffffff6c =
             (local_8->IO).KeysDownDuration[local_54] + (local_8->IO).DeltaTime;
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff6c;
      }
      else {
        in_stack_ffffffffffffff6c = 0.0;
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff6c;
      }
    }
    (local_8->IO).KeysDownDuration[local_54] = in_stack_ffffffffffffff6c;
  }
  NavUpdate();
  UpdateMouseInputs();
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar4 = GetTopMostPopupModal();
  if ((pIVar4 != (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_8->NavWindowingHighlightAlpha)))) {
    fVar7 = ImMin<float>((local_8->IO).DeltaTime * 6.0 + local_8->DimBgRatio,1.0);
    local_8->DimBgRatio = fVar7;
  }
  else {
    fVar7 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->DimBgRatio,0.0);
    local_8->DimBgRatio = fVar7;
  }
  local_8->MouseCursor = 0;
  local_8->WantTextInputNextFrame = -1;
  local_8->WantCaptureKeyboardNextFrame = -1;
  local_8->WantCaptureMouseNextFrame = -1;
  ImVec2::ImVec2(&local_5c,1.0,1.0);
  local_8->PlatformImePos = local_5c;
  UpdateMouseWheel();
  UpdateTabFocus();
  if (((local_8->GcCompactAll & 1U) != 0) ||
     (pfVar6 = &(local_8->IO).ConfigMemoryCompactTimer, *pfVar6 <= 0.0 && *pfVar6 != 0.0)) {
    fVar7 = 3.4028235e+38;
  }
  else {
    fVar7 = (float)local_8->Time - (local_8->IO).ConfigMemoryCompactTimer;
  }
  fVar9 = fVar7;
  for (local_64 = 0; local_64 != (local_8->Windows).Size; local_64 = local_64 + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_64);
    in_stack_ffffffffffffff90 = (ImGuiContext *)*ppIVar5;
    *(byte *)((long)(in_stack_ffffffffffffff90->IO).KeyMap + 0x53) =
         *(byte *)((long)(in_stack_ffffffffffffff90->IO).KeyMap + 0x52) & 1;
    *(short *)((long)&(in_stack_ffffffffffffff90->IO).KeyRepeatRate + 2) = 0;
    *(undefined1 *)((long)(in_stack_ffffffffffffff90->IO).KeyMap + 0x52) = 0;
    *(undefined1 *)((in_stack_ffffffffffffff90->IO).KeyMap + 0x15) = 0;
    if ((((*(byte *)((long)(in_stack_ffffffffffffff90->IO).KeyMap + 0x53) & 1) == 0) &&
        (((uint)(in_stack_ffffffffffffff90->IO).MouseClickedPos[2].y & 1) == 0)) &&
       (((ImVec2 *)(in_stack_ffffffffffffff90->IO).KeysDown)[0x28].x < fVar7)) {
      GcCompactTransientWindowBuffers((ImGuiWindow *)0x12cb32);
    }
  }
  for (hook_type = ImGuiContextHookType_NewFramePre;
      (int)hook_type < (local_8->TablesLastTimeActive).Size;
      hook_type = hook_type + ImGuiContextHookType_NewFramePost) {
    pfVar6 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,hook_type);
    if ((0.0 <= *pfVar6) &&
       (pfVar6 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,hook_type),
       *pfVar6 < fVar7)) {
      ImPool<ImGuiTable>::GetByIndex
                ((ImPool<ImGuiTable> *)CONCAT44(x2,in_stack_ffffffffffffff70),
                 (ImPoolIdx)in_stack_ffffffffffffff6c);
      TableGcCompactTransientBuffers((ImGuiTable *)in_stack_ffffffffffffff80);
    }
  }
  if ((local_8->GcCompactAll & 1U) != 0) {
    GcCompactTransientMiscBuffers();
  }
  local_8->GcCompactAll = false;
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
    FocusTopMostWindowUnderOne
              ((ImGuiWindow *)in_stack_ffffffffffffff90,
               (ImGuiWindow *)CONCAT44(hook_type,in_stack_ffffffffffffff88));
  }
  ImVector<ImGuiWindow_*>::resize
            ((ImVector<ImGuiWindow_*> *)CONCAT44(x2,in_stack_ffffffffffffff70),
             (int)in_stack_ffffffffffffff6c);
  ImVector<ImGuiPopupData>::resize
            ((ImVector<ImGuiPopupData> *)CONCAT44(x2,in_stack_ffffffffffffff70),
             (int)in_stack_ffffffffffffff6c);
  ImVector<int>::resize
            ((ImVector<int> *)CONCAT44(x2,in_stack_ffffffffffffff70),(int)in_stack_ffffffffffffff6c)
  ;
  ImVector<int>::push_back
            ((ImVector<int> *)CONCAT44(x2,in_stack_ffffffffffffff70),
             (int *)CONCAT44(in_stack_ffffffffffffff6c,fVar9));
  ImVector<ImGuiGroupData>::resize
            ((ImVector<ImGuiGroupData> *)CONCAT44(x2,in_stack_ffffffffffffff70),
             (int)in_stack_ffffffffffffff6c);
  ClosePopupsOverWindow((ImGuiWindow *)in_stack_ffffffffffffff90,SUB41(hook_type >> 0x18,0));
  UpdateDebugToolItemPicker();
  local_8->WithinFrameScopeWithImplicitWindow = true;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,400.0,400.0);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffff80,4);
  Begin(in_stack_00000390,in_stack_00000388,in_stack_00000384);
  CallContextHooks(in_stack_ffffffffffffff90,hook_type);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}